

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void inter_mode_data_push
               (TileDataEnc *tile_data,BLOCK_SIZE bsize,int64_t sse,int64_t dist,int residue_cost)

{
  int iVar1;
  long lVar2;
  long in_RCX;
  long in_RDX;
  BLOCK_SIZE in_SIL;
  long in_RDI;
  int in_R8D;
  double dVar3;
  double ld;
  InterModeRdModel *rd_model;
  int block_idx;
  
  if ((((in_R8D != 0) && (in_RDX != in_RCX)) &&
      (iVar1 = inter_mode_data_block_idx(in_SIL), iVar1 != -1)) &&
     (lVar2 = in_RDI + 0x5338 + (ulong)in_SIL * 0x70, *(int *)(lVar2 + 0x40) < 0x1900)) {
    dVar3 = ((double)(in_RDX - in_RCX) * 1.0) / (double)in_R8D;
    *(int *)(lVar2 + 0x40) = *(int *)(lVar2 + 0x40) + 1;
    *(double *)(lVar2 + 0x48) = (double)in_RCX + *(double *)(lVar2 + 0x48);
    *(double *)(lVar2 + 0x50) = dVar3 + *(double *)(lVar2 + 0x50);
    *(double *)(lVar2 + 0x58) = (double)in_RDX + *(double *)(lVar2 + 0x58);
    *(double *)(lVar2 + 0x60) = (double)in_RDX * (double)in_RDX + *(double *)(lVar2 + 0x60);
    *(double *)(lVar2 + 0x68) = (double)in_RDX * dVar3 + *(double *)(lVar2 + 0x68);
  }
  return;
}

Assistant:

static inline void inter_mode_data_push(TileDataEnc *tile_data,
                                        BLOCK_SIZE bsize, int64_t sse,
                                        int64_t dist, int residue_cost) {
  if (residue_cost == 0 || sse == dist) return;
  const int block_idx = inter_mode_data_block_idx(bsize);
  if (block_idx == -1) return;
  InterModeRdModel *rd_model = &tile_data->inter_mode_rd_models[bsize];
  if (rd_model->num < INTER_MODE_RD_DATA_OVERALL_SIZE) {
    const double ld = (sse - dist) * 1. / residue_cost;
    ++rd_model->num;
    rd_model->dist_sum += dist;
    rd_model->ld_sum += ld;
    rd_model->sse_sum += sse;
    rd_model->sse_sse_sum += (double)sse * (double)sse;
    rd_model->sse_ld_sum += sse * ld;
  }
}